

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderPrecisionTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::ShaderFloatPrecisionCase::init
          (ShaderFloatPrecisionCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  Precision precision;
  code *pcVar2;
  pointer pcVar3;
  ShaderFloatPrecisionCase *pSVar4;
  int iVar5;
  deUint32 err;
  int extraout_EAX;
  undefined4 extraout_var;
  char *pcVar6;
  char *pcVar7;
  char *__s;
  size_t sVar8;
  ShaderProgram *this_00;
  TestError *this_01;
  long lVar9;
  ostringstream *poVar10;
  ostringstream vtx;
  ostringstream frag;
  ProgramSources sources;
  long local_458;
  TestLog *local_450;
  RenderContext *local_448;
  pointer local_440;
  ShaderFloatPrecisionCase *local_438;
  value_type local_430;
  value_type local_410;
  undefined1 local_3f0 [376];
  undefined1 local_278 [376];
  ProgramSources local_100;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_458 = CONCAT44(extraout_var,iVar5);
  local_450 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_448 = ((this->super_TestCase).m_context)->m_renderCtx;
  precision = this->m_precision;
  local_440 = (this->m_op)._M_dataplus._M_p;
  bVar1 = this->m_isVertexCase;
  local_438 = this;
  pcVar6 = glu::getDataTypeName(TYPE_FLOAT);
  pcVar7 = glu::getDataTypeName(TYPE_UINT);
  __s = glu::getPrecisionName(precision);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3f0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
  poVar10 = (ostringstream *)local_278;
  if (bVar1 != false) {
    poVar10 = (ostringstream *)local_3f0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"#version 300 es\n",0x10);
  pSVar4 = local_438;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,"in highp vec4 a_position;\n",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"in ",3);
  if (__s == (char *)0x0) {
    std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x68);
  }
  else {
    sVar8 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,__s,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," ",1);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x68);
  }
  else {
    sVar8 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,pcVar6,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," a_in0;\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"in ",3);
  if (__s == (char *)0x0) {
    std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x68);
  }
  else {
    sVar8 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,__s,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," ",1);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x68);
  }
  else {
    sVar8 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,pcVar6,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," a_in1;\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"layout(location = 0) out highp ",0x1f);
  if (pcVar7 == (char *)0x0) {
    std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x1e0);
  }
  else {
    sVar8 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar7,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," o_out;\n",8);
  if (bVar1 == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"flat out ",9);
    if (__s == (char *)0x0) {
      std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x68);
    }
    else {
      sVar8 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,__s,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," ",1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x68);
    }
    else {
      sVar8 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,pcVar6,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," v_in0;\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"flat out ",9);
    if (__s == (char *)0x0) {
      std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x68);
    }
    else {
      sVar8 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,__s,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," ",1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x68);
    }
    else {
      sVar8 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,pcVar6,sVar8);
    }
    pcVar7 = " v_in1;\n";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," v_in1;\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"flat in ",8);
    if (__s == (char *)0x0) {
      std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x1e0);
    }
    else {
      sVar8 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,__s,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x1e0);
    }
    else {
      sVar8 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar6,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," v_in0;\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"flat in ",8);
    if (__s == (char *)0x0) {
      std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x1e0);
    }
    else {
      sVar8 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,__s,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x1e0);
    }
    else {
      sVar8 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar6,sVar8);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"flat out ",9);
    if (__s == (char *)0x0) {
      std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x68);
    }
    else {
      sVar8 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,__s,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," ",1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_3f0._0_8_ + -0x18) + 0x68);
    }
    else {
      sVar8 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,pcVar6,sVar8);
    }
    pcVar7 = " v_out;\n";
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0," v_out;\n",8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"flat in ",8);
    if (__s == (char *)0x0) {
      std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x1e0);
    }
    else {
      sVar8 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,__s,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)&local_458 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x1e0);
    }
    else {
      sVar8 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar6,sVar8);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar7,8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,"\nvoid main (void)\n{\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3f0,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"\nvoid main (void)\n{\n",0x14);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"\t",1);
  iVar5 = (int)poVar10;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)poVar10 + -0x18) + iVar5);
  }
  else {
    sVar8 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,__s,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," ",1);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)poVar10 + -0x18) + iVar5);
  }
  else {
    sVar8 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,pcVar6,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," in0 = ",7);
  pcVar7 = "v_";
  if (bVar1 != false) {
    pcVar7 = "a_";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,pcVar7,2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"in0;\n",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"\t",1);
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)poVar10 + -0x18) + iVar5);
  }
  else {
    sVar8 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,__s,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," ",1);
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)poVar10 + -0x18) + iVar5);
  }
  else {
    sVar8 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,pcVar6,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," in1 = ",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,pcVar7,2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"in1;\n",5);
  if (bVar1 == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"\t",1);
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(*(long *)poVar10 + -0x18) + iVar5);
    }
    else {
      sVar8 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,__s,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," ",1);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(*(long *)poVar10 + -0x18) + iVar5);
    }
    else {
      sVar8 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,pcVar6,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," res;\n",6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,"\t",1);
  pcVar6 = "res";
  if (bVar1 != false) {
    pcVar6 = "v_out";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,pcVar6,(ulong)bVar1 * 2 + 3)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10," = ",3);
  pcVar3 = local_440;
  if (local_440 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(*(long *)poVar10 + -0x18) + iVar5);
  }
  else {
    sVar8 = strlen(local_440);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,pcVar3,sVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar10,";\n",2);
  if (bVar1 == false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f0,"\tv_in0 = a_in0;\n",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3f0,"\tv_in1 = a_in1;\n",0x10);
    lVar9 = 0x1f;
    pcVar6 = "\to_out = floatBitsToUint(res);\n";
  }
  else {
    lVar9 = 0x21;
    pcVar6 = "\to_out = floatBitsToUint(v_out);\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar6,lVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f0,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"}\n",2);
  this_00 = (ShaderProgram *)operator_new(0xd0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_100,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources,&local_410);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100.sources + 1,&local_430);
  glu::ShaderProgram::ShaderProgram(this_00,local_448,&local_100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_100.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_100.attribLocationBindings);
  lVar9 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
  std::ios_base::~ios_base((ios_base *)(local_278 + 0x70));
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3f0);
  std::ios_base::~ios_base((ios_base *)(local_3f0 + 0x70));
  pSVar4->m_program = this_00;
  glu::operator<<(local_450,this_00);
  lVar9 = local_458;
  if ((pSVar4->m_program->m_program).m_info.linkOk == false) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,"m_program->isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
               ,0xf9);
  }
  else {
    (**(code **)(local_458 + 0x6d0))(1,&pSVar4->m_framebuffer);
    (**(code **)(lVar9 + 0x6e8))(1,&pSVar4->m_renderbuffer);
    (**(code **)(lVar9 + 0xa0))(0x8d41,pSVar4->m_renderbuffer);
    (**(code **)(lVar9 + 0x1238))(0x8d41,0x8236,0x20,0x20);
    (**(code **)(lVar9 + 0x78))(0x8d40,pSVar4->m_framebuffer);
    (**(code **)(lVar9 + 0x688))(0x8d40,0x8ce0,0x8d41,pSVar4->m_renderbuffer);
    err = (**(code **)(lVar9 + 0x800))();
    glu::checkError(err,"Post framebuffer setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
                    ,0x105);
    iVar5 = (**(code **)(lVar9 + 0x170))(0x8d40);
    if (iVar5 == 0x8cd5) {
      pcVar2 = *(code **)(lVar9 + 0x78);
      (*((pSVar4->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[6])();
      (*pcVar2)(0x8d40);
      tcu::TestContext::setTestResult
                ((pSVar4->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      pSVar4->m_iterNdx = 0;
      return extraout_EAX;
    }
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,(char *)0x0,
               "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderPrecisionTests.cpp"
               ,0x106);
  }
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderFloatPrecisionCase::init (void)
{
	const glw::Functions&	gl	= m_context.getRenderContext().getFunctions();
	TestLog&				log	= m_testCtx.getLog();

	DE_ASSERT(!m_program && !m_framebuffer && !m_renderbuffer);

	// Create program.
	m_program = createFloatPrecisionEvalProgram(m_context.getRenderContext(), m_precision, m_op.c_str(), m_isVertexCase);
	log << *m_program;

	TCU_CHECK(m_program->isOk());

	// Create framebuffer.
	gl.genFramebuffers(1, &m_framebuffer);
	gl.genRenderbuffers(1, &m_renderbuffer);

	gl.bindRenderbuffer(GL_RENDERBUFFER, m_renderbuffer);
	gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, FRAMEBUFFER_WIDTH, FRAMEBUFFER_HEIGHT);

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_framebuffer);
	gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_renderbuffer);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Post framebuffer setup");
	TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_context.getRenderContext().getDefaultFramebuffer());

	// Initialize test result to pass.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	m_iterNdx = 0;
}